

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  curl_off_t cVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char in_AL;
  int iVar8;
  FormInfo *pFVar9;
  int *piVar10;
  char *pcVar11;
  FormInfo *pFVar12;
  long *plVar13;
  curl_slist *pcVar14;
  undefined8 *puVar15;
  char *pcVar16;
  size_t sVar17;
  curl_httppost *pcVar18;
  uint uVar19;
  undefined8 in_RCX;
  size_t i;
  FormInfo *pFVar20;
  ulong uVar21;
  char **ppcVar22;
  curl_httppost *pcVar23;
  undefined8 in_RDX;
  curl_httppost **ppcVar24;
  FormInfo *ptr_1;
  size_t sVar25;
  undefined8 in_R8;
  undefined8 in_R9;
  int *piVar26;
  CURLFORMcode CVar27;
  FormInfo *ptr;
  curl_slist *pcVar28;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char *local_140;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  uVar19 = 0x10;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pFVar9 = (FormInfo *)(*Curl_ccalloc)(1,0x68);
  if (pFVar9 == (FormInfo *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar28 = (curl_slist *)0x0;
  piVar26 = (int *)0x0;
  CVar27 = CURL_FORMADD_OK;
  pFVar20 = pFVar9;
  bVar4 = false;
switchD_004c9abf_caseD_9:
  pFVar12 = pFVar9;
  if (CVar27 == CURL_FORMADD_OK) {
    if ((bool)(piVar26 != (int *)0x0 & bVar4)) goto code_r0x004c9a54;
    uVar21 = (ulong)uVar19;
    if (uVar21 < 0x29) {
      uVar19 = uVar19 + 8;
      piVar10 = (int *)((long)local_e8 + uVar21);
    }
    else {
      piVar10 = (int *)arg[0].overflow_arg_area;
      arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
    }
    iVar8 = *piVar10;
    if (iVar8 != 0x11) goto LAB_004c9aab;
    CVar27 = CURL_FORMADD_OK;
    pcVar23 = (curl_httppost *)0x0;
    pFVar20 = pFVar9;
    pcVar11 = (char *)0x0;
    goto LAB_004ca29d;
  }
  for (; pFVar12 != (FormInfo *)0x0; pFVar12 = pFVar12->more) {
    if (pFVar12->name_alloc == true) {
      (*Curl_cfree)(pFVar12->name);
      pFVar12->name = (char *)0x0;
      pFVar12->name_alloc = false;
    }
    if (pFVar12->value_alloc == true) {
      (*Curl_cfree)(pFVar12->value);
      pFVar12->value = (char *)0x0;
      pFVar12->value_alloc = false;
    }
    if (pFVar12->contenttype_alloc == true) {
      (*Curl_cfree)(pFVar12->contenttype);
      pFVar12->contenttype = (char *)0x0;
      pFVar12->contenttype_alloc = false;
    }
    if (pFVar12->showfilename_alloc == true) {
      (*Curl_cfree)(pFVar12->showfilename);
      pFVar12->showfilename = (char *)0x0;
      pFVar12->showfilename_alloc = false;
    }
  }
  goto LAB_004ca601;
code_r0x004c9a54:
  iVar8 = *piVar26;
  pcVar28 = *(curl_slist **)(piVar26 + 2);
  piVar26 = piVar26 + 4;
  CVar27 = CURL_FORMADD_OK;
  bVar4 = false;
  if (iVar8 == 0x11) goto switchD_004c9abf_caseD_9;
  bVar4 = true;
LAB_004c9aab:
  CVar27 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar14 = pcVar28;
  switch(iVar8) {
  case 2:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 4;
  case 1:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->name == (char *)0x0) {
      if (!bVar4) {
        uVar21 = (ulong)uVar19;
        if (uVar21 < 0x29) {
          uVar19 = uVar19 + 8;
          plVar13 = (long *)((long)local_e8 + uVar21);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pFVar20->name = (char *)pcVar14;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_004c9abf_caseD_9;
  case 3:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->namelength == 0) {
      if (!bVar4) {
        uVar21 = (ulong)uVar19;
        if (uVar21 < 0x29) {
          uVar19 = uVar19 + 8;
          plVar13 = (long *)((long)local_e8 + uVar21);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar20->namelength = (size_t)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004c9abf_caseD_9;
  case 5:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 8;
  case 4:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->value != (char *)0x0) goto switchD_004c9abf_caseD_9;
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar13 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_004c9abf_caseD_9;
    break;
  case 7:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if ((pFVar20->flags & 10) != 0) goto switchD_004c9abf_caseD_9;
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_004c9abf_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar20->value = pcVar11;
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_004c9abf_caseD_9;
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 2;
    goto LAB_004ca1d9;
  case 8:
    CVar27 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar7 = !bVar4;
    bVar4 = true;
    if (bVar7) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      piVar26 = (int *)*puVar15;
      bVar4 = piVar26 != (int *)0x0;
      CVar27 = (uint)(piVar26 == (int *)0x0) * 3;
    }
  default:
    goto switchD_004c9abf_caseD_9;
  case 10:
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar20->value != (char *)0x0) {
      CVar27 = CURL_FORMADD_OPTION_TWICE;
      if (((pFVar20->flags & 1) == 0) || (CVar27 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
      goto switchD_004c9abf_caseD_9;
      pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar11 == (char *)0x0) goto switchD_004c9abf_caseD_9;
      pFVar12 = AddFormInfo(pcVar11,(char *)0x0,pFVar20);
      if (pFVar12 == (FormInfo *)0x0) goto LAB_004ca1e5;
      pFVar12->value_alloc = true;
      goto LAB_004c9f9e;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_004c9abf_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar20->value = pcVar11;
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_004c9abf_caseD_9;
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 1;
LAB_004ca1d9:
    pFVar20->value_alloc = true;
    CVar27 = CURL_FORMADD_OK;
    goto switchD_004c9abf_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->showfilename == (char *)0x0) {
      pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
      pFVar20->showfilename = pcVar11;
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar11 != (char *)0x0) {
        pFVar20->showfilename_alloc = true;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_004c9abf_caseD_9;
  case 0xc:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 0x30;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->buffer != (char *)0x0) goto switchD_004c9abf_caseD_9;
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar13 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_004c9abf_caseD_9;
    pFVar20->buffer = (char *)pcVar14;
    break;
  case 0xd:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->bufferlength == 0) {
      if (!bVar4) {
        uVar21 = (ulong)uVar19;
        if (uVar21 < 0x29) {
          uVar19 = uVar19 + 8;
          plVar13 = (long *)((long)local_e8 + uVar21);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar20->bufferlength = (size_t)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004c9abf_caseD_9;
  case 0xe:
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar21);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar20->contenttype == (char *)0x0) {
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
        pFVar20->contenttype = pcVar11;
        CVar27 = CURL_FORMADD_MEMORY;
        if (pcVar11 != (char *)0x0) {
          pFVar20->contenttype_alloc = true;
          CVar27 = CURL_FORMADD_OK;
        }
      }
      goto switchD_004c9abf_caseD_9;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (((pFVar20->flags & 1) == 0) || (CVar27 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
    goto switchD_004c9abf_caseD_9;
    pcVar11 = (*Curl_cstrdup)((char *)pcVar14);
    CVar27 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_004c9abf_caseD_9;
    pFVar12 = AddFormInfo((char *)0x0,pcVar11,pFVar20);
    if (pFVar12 == (FormInfo *)0x0) {
LAB_004ca1e5:
      (*Curl_cfree)(pcVar11);
      CVar27 = CURL_FORMADD_MEMORY;
      goto switchD_004c9abf_caseD_9;
    }
    pFVar12->contenttype_alloc = true;
LAB_004c9f9e:
    CVar27 = CURL_FORMADD_OK;
    pFVar20 = pFVar12;
    goto switchD_004c9abf_caseD_9;
  case 0xf:
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar13 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->contentheader == (curl_slist *)0x0) {
      pFVar20->contentheader = pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_004c9abf_caseD_9;
  case 0x13:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 0x40;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar20->userp != (char *)0x0) goto switchD_004c9abf_caseD_9;
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar13 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_004c9abf_caseD_9;
    pFVar20->userp = (char *)pcVar14;
    break;
  case 0x14:
    *(byte *)&pFVar20->flags = (byte)pFVar20->flags | 0x80;
  case 6:
    if (!bVar4) {
      uVar21 = (ulong)uVar19;
      if (uVar21 < 0x29) {
        uVar19 = uVar19 + 8;
        plVar13 = (long *)((long)local_e8 + uVar21);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    pFVar20->contentslength = (curl_off_t)pcVar14;
    CVar27 = CURL_FORMADD_OK;
    goto switchD_004c9abf_caseD_9;
  }
  pFVar20->value = (char *)pcVar14;
  CVar27 = CURL_FORMADD_OK;
  goto switchD_004c9abf_caseD_9;
LAB_004ca29d:
  if (pFVar20 != (FormInfo *)0x0) {
    pcVar16 = pFVar20->name;
    if (pcVar16 == (char *)0x0) {
      if (pcVar23 == (curl_httppost *)0x0) goto LAB_004ca582;
LAB_004ca2c6:
      uVar21 = pFVar20->flags;
      if (((((pFVar20->contentslength != 0 & (byte)uVar21) != 0) || (((uint)uVar21 & 9) == 9)) ||
          (uVar19 = ~(uint)uVar21, (uVar19 & 10) == 0)) ||
         ((uVar19 & 0x30) == 0 && pFVar20->buffer == (char *)0x0)) goto LAB_004ca582;
      if (((uVar21 & 0x11) != 0) && (pFVar20->contenttype == (char *)0x0)) {
        ppcVar22 = &pFVar20->showfilename;
        if ((uVar21 & 0x10) == 0) {
          ppcVar22 = &pFVar20->value;
        }
        pcVar16 = Curl_mime_contenttype(*ppcVar22);
        if (pcVar16 == (char *)0x0) {
          pcVar16 = pcVar11;
        }
        if (pcVar16 == (char *)0x0) {
          pcVar16 = "application/octet-stream";
        }
        pcVar16 = (*Curl_cstrdup)(pcVar16);
        pFVar20->contenttype = pcVar16;
        if (pcVar16 != (char *)0x0) {
          pFVar20->contenttype_alloc = true;
          pcVar16 = pFVar20->name;
          goto LAB_004ca365;
        }
LAB_004ca588:
        CVar27 = CURL_FORMADD_MEMORY;
        goto LAB_004ca5ea;
      }
LAB_004ca365:
      if ((pcVar16 != (char *)0x0) && (pFVar20->namelength != 0)) {
        sVar25 = 0;
        while (pFVar20->namelength != sVar25) {
          pcVar1 = pcVar16 + sVar25;
          sVar25 = sVar25 + 1;
          if (*pcVar1 == '\0') {
            CVar27 = CURL_FORMADD_NULL;
            goto LAB_004ca5ea;
          }
        }
      }
      uVar21 = pFVar20->flags;
      if (pFVar20 == pFVar9 && (uVar21 & 4) == 0) {
        if (pcVar16 != (char *)0x0) {
          sVar25 = pFVar20->namelength;
          if (sVar25 == 0) {
            sVar17 = strlen(pcVar16);
            sVar25 = sVar17 + 1;
          }
          pcVar16 = (char *)Curl_memdup(pcVar16,sVar25);
          pFVar20->name = pcVar16;
          if (pcVar16 != (char *)0x0) {
            pFVar20->name_alloc = true;
            uVar21 = pFVar20->flags;
            goto LAB_004ca3de;
          }
        }
        goto LAB_004ca588;
      }
LAB_004ca3de:
      local_140 = pFVar20->value;
      if ((uVar21 & 0x6b) == 0) {
        if (local_140 == (char *)0x0) {
          local_140 = (char *)0x0;
        }
        else {
          sVar25 = pFVar20->contentslength;
          if (sVar25 == 0) {
            sVar17 = strlen(local_140);
            sVar25 = sVar17 + 1;
          }
          local_140 = (char *)Curl_memdup(local_140,sVar25);
          pFVar20->value = local_140;
          if (local_140 == (char *)0x0) goto LAB_004ca588;
          pFVar20->value_alloc = true;
          pcVar16 = pFVar20->name;
          uVar21 = pFVar20->flags;
        }
      }
      sVar17 = pFVar20->namelength;
      cVar2 = pFVar20->contentslength;
      pcVar1 = pFVar20->buffer;
      sVar25 = pFVar20->bufferlength;
      pcVar3 = pFVar20->contenttype;
      pcVar28 = pFVar20->contentheader;
      pcVar5 = pFVar20->showfilename;
      pcVar6 = pFVar20->userp;
      if (pcVar16 != (char *)0x0 && sVar17 == 0) {
        sVar17 = strlen(pcVar16);
      }
      if ((((long)sVar25 < 0) || ((long)sVar17 < 0)) ||
         (pcVar18 = (curl_httppost *)(*Curl_ccalloc)(1,0x70), pcVar18 == (curl_httppost *)0x0))
      goto LAB_004ca588;
      pcVar18->name = pcVar16;
      pcVar18->namelength = sVar17;
      pcVar18->contents = local_140;
      pcVar18->contentlen = cVar2;
      pcVar18->buffer = pcVar1;
      pcVar18->bufferlength = sVar25;
      pcVar18->contenttype = pcVar3;
      pcVar18->contentheader = pcVar28;
      pcVar18->showfilename = pcVar5;
      pcVar18->userp = pcVar6;
      pcVar18->flags = uVar21 | 0x80;
      if (pcVar23 == (curl_httppost *)0x0) {
        pcVar23 = *last_post;
        if (*last_post == (curl_httppost *)0x0) {
          pcVar23 = (curl_httppost *)httppost;
        }
        pcVar23->next = pcVar18;
        ppcVar24 = last_post;
      }
      else {
        pcVar18->more = pcVar23->more;
        ppcVar24 = &pcVar23->more;
      }
      *ppcVar24 = pcVar18;
      ppcVar22 = &pFVar20->contenttype;
      pFVar20 = pFVar20->more;
      pcVar23 = pcVar18;
      if (*ppcVar22 != (char *)0x0) {
        pcVar11 = *ppcVar22;
      }
      goto LAB_004ca29d;
    }
    if (pFVar20->value != (char *)0x0 || pcVar23 != (curl_httppost *)0x0) goto LAB_004ca2c6;
LAB_004ca582:
    CVar27 = CURL_FORMADD_INCOMPLETE;
LAB_004ca5ea:
    for (; pFVar20 != (FormInfo *)0x0; pFVar20 = pFVar20->more) {
      if (pFVar20->name_alloc == true) {
        (*Curl_cfree)(pFVar20->name);
        pFVar20->name = (char *)0x0;
        pFVar20->name_alloc = false;
      }
      if (pFVar20->value_alloc == true) {
        (*Curl_cfree)(pFVar20->value);
        pFVar20->value = (char *)0x0;
        pFVar20->value_alloc = false;
      }
      if (pFVar20->contenttype_alloc == true) {
        (*Curl_cfree)(pFVar20->contenttype);
        pFVar20->contenttype = (char *)0x0;
        pFVar20->contenttype_alloc = false;
      }
      if (pFVar20->showfilename_alloc == true) {
        (*Curl_cfree)(pFVar20->showfilename);
        pFVar20->showfilename = (char *)0x0;
        pFVar20->showfilename_alloc = false;
      }
    }
  }
LAB_004ca601:
  while (pFVar9 != (FormInfo *)0x0) {
    pFVar20 = pFVar9->more;
    (*Curl_cfree)(pFVar9);
    pFVar9 = pFVar20;
  }
  return CVar27;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}